

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O3

void cdef_copy_rect8_8bit_to_16bit_avx2
               (uint16_t *dst,int dstride,uint8_t *src,int sstride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  long lVar8;
  uint16_t *puVar9;
  uint8_t *puVar10;
  uint uVar11;
  undefined1 (*pauVar12) [16];
  ulong *puVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  undefined1 (*pauVar17) [32];
  uint16_t *puVar18;
  long lVar19;
  int iVar20;
  uint8_t *puVar21;
  
  iVar20 = 0;
  lVar19 = (long)height;
  lVar7 = (long)sstride;
  lVar8 = (long)dstride;
  uVar11 = width;
  if (0x1f < width) {
    puVar9 = dst + lVar8 + 0x10;
    puVar18 = dst + 0x10;
    puVar21 = src + lVar7 + 0x10;
    puVar10 = src + 0x10;
    lVar16 = 0;
    do {
      uVar15 = 0;
      do {
        auVar3 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar10 + (uVar15 - 0x10)));
        auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar10 + uVar15));
        auVar5 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar21 + (uVar15 - 0x10)));
        auVar6 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar21 + uVar15));
        *(undefined1 (*) [32])(puVar18 + (uVar15 - 0x10)) = auVar3;
        *(undefined1 (*) [32])(puVar18 + uVar15) = auVar4;
        *(undefined1 (*) [32])(puVar9 + (uVar15 - 0x10)) = auVar5;
        *(undefined1 (*) [32])(puVar9 + uVar15) = auVar6;
        uVar15 = uVar15 + 0x20;
      } while (uVar15 <= width - 0x20U);
      lVar16 = lVar16 + 2;
      puVar9 = puVar9 + lVar8 * 2;
      puVar18 = puVar18 + lVar8 * 2;
      puVar21 = puVar21 + lVar7 * 2;
      puVar10 = puVar10 + lVar7 * 2;
    } while (lVar16 < lVar19);
    iVar20 = (width - 0x20U & 0xffffffe0) + 0x20;
    uVar11 = width & 0x1f;
  }
  if (0xf < (int)uVar11) {
    pauVar12 = (undefined1 (*) [16])(src + iVar20);
    pauVar17 = (undefined1 (*) [32])(dst + iVar20);
    lVar16 = 0;
    do {
      auVar3 = vpmovzxbw_avx2(*pauVar12);
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*pauVar12 + lVar7));
      *pauVar17 = auVar3;
      *(undefined1 (*) [32])(*pauVar17 + lVar8 * 2) = auVar4;
      lVar16 = lVar16 + 2;
      pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar7 * 2);
      pauVar17 = (undefined1 (*) [32])(*pauVar17 + lVar8 * 4);
    } while (lVar16 < lVar19);
    uVar11 = width & 0xf;
    iVar20 = iVar20 + 0x10;
  }
  if (7 < (int)uVar11) {
    puVar13 = (ulong *)(src + iVar20);
    pauVar12 = (undefined1 (*) [16])(dst + iVar20);
    lVar16 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *puVar13;
      auVar1 = vpmovzxbw_avx(auVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)puVar13 + lVar7);
      auVar2 = vpmovzxbw_avx(auVar2);
      *pauVar12 = auVar1;
      *(undefined1 (*) [16])(*pauVar12 + lVar8 * 2) = auVar2;
      lVar16 = lVar16 + 2;
      puVar13 = (ulong *)((long)puVar13 + lVar7 * 2);
      pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar8 * 4);
    } while (lVar16 < lVar19);
    uVar11 = width & 7;
    iVar20 = iVar20 + 8;
  }
  if (3 < (int)uVar11) {
    puVar14 = (uint *)(src + iVar20);
    puVar18 = dst + iVar20;
    lVar16 = 0;
    do {
      uVar11 = *(uint *)((long)puVar14 + lVar7);
      auVar1 = vpmovzxbw_avx(ZEXT416(*puVar14));
      *(long *)puVar18 = auVar1._0_8_;
      auVar1 = vpmovzxbw_avx(ZEXT416(uVar11));
      *(long *)(puVar18 + lVar8) = auVar1._0_8_;
      lVar16 = lVar16 + 2;
      puVar14 = (uint *)((long)puVar14 + lVar7 * 2);
      puVar18 = puVar18 + lVar8 * 2;
    } while (lVar16 < lVar19);
    uVar11 = width & 3;
    iVar20 = iVar20 + 4;
  }
  if (0 < height && uVar11 != 0) {
    uVar15 = 0;
    do {
      lVar19 = (long)iVar20;
      if (iVar20 < width) {
        do {
          dst[lVar19] = (ushort)src[lVar19];
          lVar19 = lVar19 + 1;
        } while (width != lVar19);
      }
      uVar15 = uVar15 + 1;
      dst = dst + lVar8;
      src = src + lVar7;
    } while (uVar15 != (uint)height);
  }
  return;
}

Assistant:

void cdef_copy_rect8_8bit_to_16bit_avx2(uint16_t *dst, int dstride,
                                        const uint8_t *src, int sstride,
                                        int width, int height) {
  int j = 0;
  int remaining_width = width;
  assert(height % 2 == 0);
  assert(height > 0);
  assert(width > 0);

  // Process multiple 32 pixels at a time.
  if (remaining_width > 31) {
    int i = 0;
    do {
      j = 0;
      do {
        __m128i row00 =
            _mm_loadu_si128((const __m128i *)&src[(i + 0) * sstride + (j + 0)]);
        __m128i row01 = _mm_loadu_si128(
            (const __m128i *)&src[(i + 0) * sstride + (j + 16)]);
        __m128i row10 =
            _mm_loadu_si128((const __m128i *)&src[(i + 1) * sstride + (j + 0)]);
        __m128i row11 = _mm_loadu_si128(
            (const __m128i *)&src[(i + 1) * sstride + (j + 16)]);
        _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + (j + 0)],
                            _mm256_cvtepu8_epi16(row00));
        _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + (j + 16)],
                            _mm256_cvtepu8_epi16(row01));
        _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + (j + 0)],
                            _mm256_cvtepu8_epi16(row10));
        _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + (j + 16)],
                            _mm256_cvtepu8_epi16(row11));
        j += 32;
      } while (j <= width - 32);
      i += 2;
    } while (i < height);
    remaining_width = width & 31;
  }

  // Process 16 pixels at a time.
  if (remaining_width > 15) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_loadu_si128((const __m128i *)&src[(i + 0) * sstride + j]);
      __m128i row1 =
          _mm_loadu_si128((const __m128i *)&src[(i + 1) * sstride + j]);
      _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + j],
                          _mm256_cvtepu8_epi16(row0));
      _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + j],
                          _mm256_cvtepu8_epi16(row1));
      i += 2;
    } while (i < height);
    remaining_width = width & 15;
    j += 16;
  }

  // Process 8 pixels at a time.
  if (remaining_width > 7) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_loadl_epi64((const __m128i *)&src[(i + 0) * sstride + j]);
      __m128i row1 =
          _mm_loadl_epi64((const __m128i *)&src[(i + 1) * sstride + j]);
      _mm_storeu_si128((__m128i *)&dst[(i + 0) * dstride + j],
                       _mm_unpacklo_epi8(row0, _mm_setzero_si128()));
      _mm_storeu_si128((__m128i *)&dst[(i + 1) * dstride + j],
                       _mm_unpacklo_epi8(row1, _mm_setzero_si128()));
      i += 2;
    } while (i < height);
    remaining_width = width & 7;
    j += 8;
  }

  // Process 4 pixels at a time.
  if (remaining_width > 3) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_cvtsi32_si128(*((const int32_t *)&src[(i + 0) * sstride + j]));
      __m128i row1 =
          _mm_cvtsi32_si128(*((const int32_t *)&src[(i + 1) * sstride + j]));
      _mm_storel_epi64((__m128i *)&dst[(i + 0) * dstride + j],
                       _mm_unpacklo_epi8(row0, _mm_setzero_si128()));
      _mm_storel_epi64((__m128i *)&dst[(i + 1) * dstride + j],
                       _mm_unpacklo_epi8(row1, _mm_setzero_si128()));
      i += 2;
    } while (i < height);
    remaining_width = width & 3;
    j += 4;
  }

  // Process the remaining pixels.
  if (remaining_width) {
    for (int i = 0; i < height; i++) {
      for (int k = j; k < width; k++) {
        dst[i * dstride + k] = src[i * sstride + k];
      }
    }
  }
}